

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02b.cpp
# Opt level: O3

void day2b::run(void)

{
  int iVar1;
  ostream *poVar2;
  string input;
  char local_29;
  string local_28;
  
  read_file_abi_cxx11_(&local_28,"input/day2.txt");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"day2b ",6);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  iVar1 = get_bathroom_code(&local_28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  local_29 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day2.txt");
		std::cout << "day2b ";
		std::cout << std::hex << get_bathroom_code(input) << '\n';
		//std::cout << std::hex << get_bathroom_code("ULL\nRRDDD\nLURDL\nUUUUD") << '\n';
		std::cout << std::dec;
	}